

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O3

Aig_Man_t * Saig_ManFramesBmcLimit(Aig_Man_t *pAig,int nFrames,int nSizeMax)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  Aig_Obj_t *p1;
  long lVar9;
  uint uVar10;
  int iVar11;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc.c"
                  ,0x7f,"Aig_Man_t *Saig_ManFramesBmcLimit(Aig_Man_t *, int, int)");
  }
  p = Aig_ManStart(nSizeMax);
  Aig_ManIncrementTravId(p);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nRegs) {
    iVar2 = 0;
    do {
      uVar8 = pAig->nTruePis + iVar2;
      if (((int)uVar8 < 0) || (pAig->vCis->nSize <= (int)uVar8)) {
LAB_00563191:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(ulong *)((long)pAig->vCis->pArray[uVar8] + 0x28) = (ulong)p->pConst1 ^ 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 < pAig->nRegs);
  }
  if (0 < nFrames) {
    iVar2 = 0;
    iVar11 = 0;
    while( true ) {
      if (0 < pAig->nTruePis) {
        lVar9 = 0;
        do {
          if (pAig->vCis->nSize <= lVar9) goto LAB_00563191;
          pvVar1 = pAig->vCis->pArray[lVar9];
          pAVar4 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAig->nTruePis);
      }
      pVVar6 = pAig->vObjs;
      if (0 < pVVar6->nSize) {
        lVar9 = 0;
        do {
          pvVar1 = pVVar6->pArray[lVar9];
          if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar1 & 1) != 0) goto LAB_005631b0;
            uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              pAVar4 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar4 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
            }
            uVar5 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
            }
            pAVar4 = Aig_And(p,pAVar4,p1);
            *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
            pVVar6 = pAig->vObjs;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar6->nSize);
      }
      if (0 < pAig->nTruePos) {
        lVar9 = 0;
        do {
          if (pAig->vCos->nSize <= lVar9) goto LAB_00563191;
          pvVar1 = pAig->vCos->pArray[lVar9];
          if (((ulong)pvVar1 & 1) != 0) goto LAB_005631b0;
          uVar5 = *(ulong *)((long)pvVar1 + 8);
          uVar7 = uVar5 & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          pAVar4 = Aig_ObjCreateCo(p,pAVar4);
          iVar3 = Saig_ManFramesCount_rec
                            (p,(Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe));
          iVar2 = iVar2 + iVar3;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAig->nTruePos);
      }
      if ((nSizeMax <= iVar2) || (iVar11 == nFrames + -1)) break;
      if (0 < pAig->nRegs) {
        iVar3 = 0;
        do {
          uVar8 = pAig->nTruePos + iVar3;
          if (((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) goto LAB_00563191;
          pvVar1 = pAig->vCos->pArray[uVar8];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_005631b0:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            uVar5 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28);
          }
          *(ulong *)((long)pvVar1 + 0x28) = uVar5;
          iVar3 = iVar3 + 1;
        } while (iVar3 < pAig->nRegs);
        if (0 < pAig->nRegs) {
          iVar3 = 0;
          do {
            uVar8 = pAig->nTruePos + iVar3;
            if (((((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) ||
                (uVar10 = pAig->nTruePis + iVar3, (int)uVar10 < 0)) ||
               (pAig->vCis->nSize <= (int)uVar10)) goto LAB_00563191;
            *(undefined8 *)((long)pAig->vCis->pArray[uVar10] + 0x28) =
                 *(undefined8 *)((long)pAig->vCos->pArray[uVar8] + 0x28);
            iVar3 = iVar3 + 1;
          } while (iVar3 < pAig->nRegs);
        }
      }
      iVar11 = iVar11 + 1;
    }
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManFramesBmcLimit( Aig_Man_t * pAig, int nFrames, int nSizeMax )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjPo;
    int i, f, Counter = 0;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( nSizeMax );
    Aig_ManIncrementTravId( pFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ManConst0( pFrames );
    // add timeframes
    Counter = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // create POs for this frame
        Saig_ManForEachPo( pAig, pObj, i )
        {
            pObjPo = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Copy(pObj) );
            Counter += Saig_ManFramesCount_rec( pFrames, Aig_ObjFanin0(pObjPo) );
        }
        if ( Counter >= nSizeMax )
        {
            Aig_ManCleanup( pFrames );
            return pFrames;
        }
        if ( f == nFrames - 1 )
            break;
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}